

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

string * __thiscall
ast::BlockStmt::toString_abi_cxx11_(string *__return_storage_ptr__,BlockStmt *this)

{
  pointer ppSVar1;
  ostream *poVar2;
  pointer ppSVar3;
  ostringstream msg;
  ostringstream aoStack_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  poVar2 = std::operator<<((ostream *)aoStack_198,"{");
  std::endl<char,std::char_traits<char>>(poVar2);
  ppSVar1 = (this->Stmts).super__Vector_base<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppSVar3 = (this->Stmts).super__Vector_base<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppSVar3 != ppSVar1; ppSVar3 = ppSVar3 + 1) {
    ast::operator<<((ostream *)aoStack_198,*ppSVar3);
    std::endl<char,std::char_traits<char>>((ostream *)aoStack_198);
  }
  std::operator<<((ostream *)aoStack_198,"}");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string ast::BlockStmt::toString() const {
    std::ostringstream msg;
    msg << "{" << std::endl;
    for(auto stmt : Stmts){
        msg << stmt;
        msg << std::endl;
    }
    msg << "}";
    return msg.str();
}